

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

int __thiscall
CGraphics_Threaded::LoadTextureRawSub
          (CGraphics_Threaded *this,CTextureHandle TextureID,int x,int y,int Width,int Height,
          int Format,void *pData)

{
  long lVar1;
  void *dest;
  int iVar2;
  uint size;
  long in_FS_OFFSET;
  CTextureUpdateCommand Cmd;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < TextureID.m_Id) {
    Cmd.super_CCommand.m_Cmd = 5;
    Cmd.super_CCommand.m_pNext = (CCommand *)0x0;
    if ((uint)Format < 3) {
      Cmd.m_Format = Format + 1;
      iVar2 = *(int *)(&DAT_001c5388 + (ulong)(uint)Format * 4);
    }
    else {
      iVar2 = 0;
      Cmd.m_Format = 2;
    }
    size = Height * Width * iVar2;
    Cmd.m_Slot = TextureID.m_Id;
    Cmd.m_X = x;
    Cmd.m_Y = y;
    Cmd.m_Width = Width;
    Cmd.m_Height = Height;
    dest = mem_alloc(size);
    mem_copy(dest,pData,size);
    Cmd.m_pData = dest;
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureUpdateCommand>(this->m_pCommandBuffer,&Cmd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphics_Threaded::LoadTextureRawSub(CTextureHandle TextureID, int x, int y, int Width, int Height, int Format, const void *pData)
{
	if(!TextureID.IsValid())
		return 0;

	CCommandBuffer::CTextureUpdateCommand Cmd;
	Cmd.m_Slot = TextureID.Id();
	Cmd.m_X = x;
	Cmd.m_Y = y;
	Cmd.m_Width = Width;
	Cmd.m_Height = Height;
	Cmd.m_Format = ImageFormatToTexFormat(Format);

	// calculate memory usage
	const int MemSize = Width * Height * CImageInfo::GetPixelSize(Format);

	// copy texture data
	void *pTmpData = mem_alloc(MemSize);
	mem_copy(pTmpData, pData, MemSize);
	Cmd.m_pData = pTmpData;

	//
	m_pCommandBuffer->AddCommand(Cmd);
	return 0;
}